

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

logical pnga_locate(Integer g_a,Integer *subscript,Integer *owner)

{
  long lVar1;
  short sVar2;
  C_Integer *pCVar3;
  long lVar4;
  global_array_t *pgVar5;
  long lVar6;
  uint uVar7;
  long *plVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  bool bVar20;
  Integer proc_s [7];
  long local_138 [33];
  
  lVar6 = g_a + 1000;
  if ((g_a < -1000) || (_max_global_array <= lVar6)) {
    sprintf((char *)local_138,"%s: INVALID ARRAY HANDLE","nga_locate");
    pnga_error((char *)local_138,g_a);
  }
  if (GA[lVar6].actv == 0) {
    sprintf((char *)local_138,"%s: ARRAY NOT ACTIVE","nga_locate");
    pnga_error((char *)local_138,g_a);
  }
  pgVar5 = GA;
  sVar2 = GA[lVar6].ndim;
  uVar14 = (uint)sVar2;
  lVar10 = (long)(int)uVar14;
  if (GA[lVar6].distr_type == 0) {
    *owner = -1;
    if (0 < sVar2) {
      lVar19 = 0;
      do {
        if (subscript[lVar19] < 1) {
          return 0;
        }
        if (pgVar5[g_a + 1000].dims[lVar19] < subscript[lVar19]) {
          return 0;
        }
        lVar19 = lVar19 + 1;
      } while (lVar10 != lVar19);
      if (0 < sVar2) {
        pCVar3 = pgVar5[lVar6].mapc;
        lVar19 = 0;
        lVar17 = 0;
        do {
          lVar15 = subscript[lVar19];
          uVar7 = (uint)((double)lVar15 * pgVar5[lVar6].scale[lVar19]);
          uVar14 = pgVar5[lVar6].nblock[lVar19];
          uVar12 = uVar14 - 1;
          if (uVar14 == uVar7) {
            uVar7 = uVar12;
          }
          lVar13 = (long)(int)uVar7;
          if (lVar15 < pCVar3[lVar17 + lVar13]) {
            plVar8 = pCVar3 + lVar17 + ((ulong)uVar7 - 1);
            do {
              uVar18 = uVar12;
              if ((int)uVar7 < 1) break;
              uVar18 = uVar7 - 1;
              lVar13 = *plVar8;
              plVar8 = plVar8 + -1;
              uVar7 = uVar18;
            } while (lVar15 < lVar13);
          }
          else {
            uVar9 = uVar12;
            if ((int)uVar12 < (int)uVar7) {
              uVar9 = uVar7;
            }
            lVar11 = 0;
            do {
              uVar18 = uVar12;
              if ((int)uVar9 - lVar13 == lVar11) goto LAB_0016360a;
              lVar1 = lVar11 + 1;
              lVar4 = lVar11 + 1;
              lVar11 = lVar1;
            } while (pCVar3[lVar17 + lVar13 + lVar4] <= lVar15);
            uVar18 = (uVar7 + (int)lVar1) - 1;
          }
LAB_0016360a:
          local_138[lVar19] = (long)(int)uVar18;
          lVar17 = lVar17 + (int)uVar14;
          lVar19 = lVar19 + 1;
        } while (lVar19 != lVar10);
        if (sVar2 < 1) {
          lVar19 = 0;
        }
        else {
          lVar19 = 0;
          lVar15 = 0;
          lVar17 = 1;
          do {
            lVar13 = lVar17;
            if (lVar15 < lVar10 + -1) {
              lVar13 = pgVar5[g_a + 1000].nblock[lVar15] * lVar17;
            }
            lVar19 = lVar19 + lVar17 * local_138[lVar15];
            lVar15 = lVar15 + 1;
            lVar17 = lVar13;
          } while (lVar10 != lVar15);
        }
        goto LAB_0016372b;
      }
    }
    lVar19 = 0;
LAB_0016372b:
    *owner = lVar19;
    if (pgVar5[lVar6].num_rstrctd < 1) {
      return 1;
    }
    *owner = pgVar5[lVar6].rstrctd_list[lVar19];
    return 1;
  }
  if (GA[lVar6].distr_type == 4) {
    if (sVar2 < 1) {
LAB_00163704:
      lVar6 = local_138[lVar10 + -1];
      goto LAB_0016370f;
    }
    pCVar3 = GA[lVar6].mapc;
    uVar16 = 0;
    lVar19 = 0;
    do {
      lVar17 = subscript[uVar16];
      uVar7 = (uint)((double)lVar17 * GA[lVar6].scale[uVar16]);
      lVar15 = GA[lVar6].num_blocks[uVar16];
      uVar12 = (int)lVar15 - 1;
      if (lVar15 == (int)uVar7) {
        uVar7 = uVar12;
      }
      if (lVar17 < pCVar3[lVar19 + (int)uVar7]) {
        plVar8 = pCVar3 + lVar19 + ((ulong)uVar7 - 1);
        do {
          uVar18 = uVar12;
          if ((int)uVar7 < 1) break;
          uVar7 = uVar7 - 1;
          lVar13 = *plVar8;
          plVar8 = plVar8 + -1;
          uVar18 = uVar7;
        } while (lVar17 < lVar13);
      }
      else {
        uVar9 = uVar7 - 1;
        lVar13 = (long)(int)uVar7;
        do {
          uVar18 = uVar12;
          if (lVar15 + -1 <= lVar13) break;
          uVar9 = uVar9 + 1;
          lVar11 = lVar13 + 1;
          lVar13 = lVar13 + 1;
          uVar18 = uVar9;
        } while (pCVar3[lVar19 + lVar11] <= lVar17);
      }
      local_138[uVar16] = (long)(int)uVar18;
      lVar19 = lVar19 + lVar15;
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar14);
  }
  else {
    if (sVar2 < 1) goto LAB_00163704;
    uVar16 = 0;
    do {
      local_138[uVar16] = (subscript[uVar16] + -1) / GA[g_a + 1000].block_dims[uVar16];
      uVar16 = uVar16 + 1;
    } while (uVar14 != uVar16);
  }
  lVar6 = local_138[lVar10 + -1];
  if (1 < sVar2) {
    uVar16 = (ulong)(uVar14 - 2);
    do {
      lVar6 = lVar6 * GA[g_a + 1000].num_blocks[uVar16] + local_138[uVar16];
      bVar20 = uVar16 != 0;
      uVar16 = uVar16 - 1;
    } while (bVar20);
  }
LAB_0016370f:
  *owner = lVar6;
  return 1;
}

Assistant:

logical pnga_locate(Integer g_a, Integer* subscript, Integer* owner)
{
Integer d, proc, dpos, ndim, ga_handle = GA_OFFSET + g_a, proc_s[MAXDIM];

   ga_check_handleM(g_a, "nga_locate");
   ndim = GA[ga_handle].ndim;

   if (GA[ga_handle].distr_type == REGULAR) {
     for(d=0, *owner=-1; d< ndim; d++) 
       if(subscript[d]< 1 || subscript[d]>GA[ga_handle].dims[d]) return FALSE;

     for(d = 0, dpos = 0; d< ndim; d++){
       findblock(GA[ga_handle].mapc + dpos, GA[ga_handle].nblock[d],
           GA[ga_handle].scale[d], subscript[d], &proc_s[d]);
       dpos += GA[ga_handle].nblock[d];
     }

     ga_ComputeIndexM(&proc, ndim, proc_s, GA[ga_handle].nblock); 

     *owner = proc;
     if (GA[ga_handle].num_rstrctd > 0) {
       *owner = GA[ga_handle].rstrctd_list[*owner];
     }
   } else {
     Integer i;
     Integer index[MAXDIM];
     gam_find_block_indices_from_subscript(ga_handle,subscript,index);
     gam_find_block_from_indices(ga_handle,i,index);    
     *owner = i;
   }
   
   return TRUE;
}